

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindIssueData
          (UnblindParameter *__return_storage_ptr__,Privkey *blinding_key,ByteData *rangeproof,
          ConfidentialValue *value_commitment,Script *extra,ConfidentialAssetId *asset)

{
  bool bVar1;
  value_type_conflict *__val;
  CfdException *pCVar2;
  pointer puVar3;
  ulong uVar4;
  size_t sVar5;
  Amount AVar6;
  undefined1 local_158 [32];
  uint8_t local_138;
  uchar *local_128;
  undefined1 local_120 [16];
  _func_int **local_110;
  int ret;
  _func_int **local_100;
  pointer local_f8;
  _func_int **local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  uint64_t value_out;
  
  Privkey::GetData((ByteData *)local_158,blinding_key);
  ByteData::GetBytes(&nonce_bytes,(ByteData *)local_158);
  if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  ByteData::GetBytes(&rangeproof_bytes,rangeproof);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,
             &(value_commitment->data_).data_);
  ByteData::GetBytes(&commitment_bytes,(ByteData *)local_158);
  if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  bVar1 = Script::IsEmpty(extra);
  local_f8 = (pointer)0x0;
  puVar3 = (pointer)0x0;
  local_100 = (_func_int **)0x0;
  if (!bVar1) {
    Script::GetData((ByteData *)&asset_bytes,extra);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,
                       (ByteData *)&asset_bytes);
    puVar3 = (pointer)local_158._8_8_;
    local_100 = (_func_int **)local_158._0_8_;
    local_f8 = (pointer)local_158._16_8_;
    local_158._0_8_ = (_func_int **)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    if (asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)asset_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)asset_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_f0 = (_func_int **)operator_new(0x20);
  local_f0[2] = (_func_int *)0x0;
  local_f0[3] = (_func_int *)0x0;
  *local_f0 = (_func_int *)0x0;
  local_f0[1] = (_func_int *)0x0;
  ConfidentialAssetId::GetUnblindedData((ByteData *)local_158,asset);
  ByteData::GetBytes(&asset_bytes,(ByteData *)local_158);
  if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  local_128 = (uchar *)operator_new(0x21);
  local_128[0x10] = '\0';
  local_128[0x11] = '\0';
  local_128[0x12] = '\0';
  local_128[0x13] = '\0';
  local_128[0x14] = '\0';
  local_128[0x15] = '\0';
  local_128[0x16] = '\0';
  local_128[0x17] = '\0';
  local_128[0x18] = '\0';
  local_128[0x19] = '\0';
  local_128[0x1a] = '\0';
  local_128[0x1b] = '\0';
  local_128[0x1c] = '\0';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  local_128[0x20] = '\0';
  ret = wally_asset_generator_from_bytes
                  (asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)asset_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)asset_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(uchar *)local_f0,0x20,local_128,0x21);
  if (ret == 0) {
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x20;
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x20;
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x20;
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    value_out = 0;
    asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ret = wally_asset_unblind_with_nonce
                    (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)nonce_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)nonce_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     rangeproof_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)rangeproof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)rangeproof_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     commitment_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)commitment_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)commitment_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(uchar *)local_100,
                     (long)puVar3 - (long)local_100,local_128,0x21,
                     asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,0x20,
                     abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                     vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,&value_out);
    if (ret != 0) {
      local_158._0_8_ = "cfdcore_elements_transaction.cpp";
      local_158._8_4_ = 0xbf2;
      local_158._16_8_ = "CalculateUnblindIssueData";
      logger::log<int&>((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
                        "wally_asset_unblind_with_nonce NG[{}].",&ret);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      local_158._0_8_ = local_158 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"unblind confidential data error.","");
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_158);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    UnblindParameter::UnblindParameter(__return_storage_ptr__);
    ByteData::ByteData((ByteData *)local_120,&asset_out);
    ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_158,(ByteData *)local_120)
    ;
    if ((UnblindParameter *)local_158 != __return_storage_ptr__) {
      ByteData::operator=(&(__return_storage_ptr__->asset).data_,(ByteData *)(local_158 + 8));
      (__return_storage_ptr__->asset).version_ = local_138;
    }
    local_158._0_8_ = &PTR__ConfidentialAssetId_007f6a80;
    if ((pointer)local_158._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._8_8_,local_158._24_8_ - local_158._8_8_);
    }
    if ((pointer)local_120._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_120._0_8_,(long)local_110 - local_120._0_8_);
    }
    ByteData256::ByteData256((ByteData256 *)local_120,&abf_out);
    local_158._0_8_ = &PTR__BlindFactor_007f83c8;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    local_158._24_8_ = (pointer)0x0;
    uVar4 = CONCAT71(local_120._9_7_,local_120[8]) - local_120._0_8_;
    if (uVar4 == 0) {
      puVar3 = (pointer)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar3 = (pointer)operator_new(uVar4);
    }
    local_158._24_8_ = puVar3 + uVar4;
    sVar5 = CONCAT71(local_120._9_7_,local_120[8]) - local_120._0_8_;
    local_158._8_8_ = puVar3;
    if (sVar5 != 0) {
      local_158._16_8_ = puVar3;
      memmove(puVar3,(void *)local_120._0_8_,sVar5);
    }
    local_158._16_8_ = puVar3 + sVar5;
    if (&__return_storage_ptr__->abf != (BlindFactor *)local_158) {
      ByteData256::operator=(&(__return_storage_ptr__->abf).data_,(ByteData256 *)(local_158 + 8));
    }
    local_158._0_8_ = &PTR__BlindFactor_007f83c8;
    if ((pointer)local_158._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._8_8_,local_158._24_8_ - local_158._8_8_);
    }
    if ((pointer)local_120._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_120._0_8_,(long)local_110 - local_120._0_8_);
    }
    ByteData256::ByteData256((ByteData256 *)local_120,&vbf_out);
    local_158._0_8_ = &PTR__BlindFactor_007f83c8;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    local_158._24_8_ = (pointer)0x0;
    uVar4 = CONCAT71(local_120._9_7_,local_120[8]) - local_120._0_8_;
    if (uVar4 == 0) {
      puVar3 = (pointer)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar3 = (pointer)operator_new(uVar4);
    }
    local_158._24_8_ = puVar3 + uVar4;
    sVar5 = CONCAT71(local_120._9_7_,local_120[8]) - local_120._0_8_;
    local_158._8_8_ = puVar3;
    if (sVar5 != 0) {
      local_158._16_8_ = puVar3;
      memmove(puVar3,(void *)local_120._0_8_,sVar5);
    }
    local_158._16_8_ = puVar3 + sVar5;
    if (&__return_storage_ptr__->vbf != (BlindFactor *)local_158) {
      ByteData256::operator=(&(__return_storage_ptr__->vbf).data_,(ByteData256 *)(local_158 + 8));
    }
    local_158._0_8_ = &PTR__BlindFactor_007f83c8;
    if ((pointer)local_158._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._8_8_,local_158._24_8_ - local_158._8_8_);
    }
    if ((pointer)local_120._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_120._0_8_,(long)local_110 - local_120._0_8_);
    }
    AVar6 = Amount::CreateBySatoshiAmount(value_out);
    local_120._0_8_ = AVar6.amount_;
    local_120[8] = AVar6.ignore_check_;
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_158,(Amount *)local_120);
    if (&__return_storage_ptr__->value != (ConfidentialValue *)local_158) {
      ByteData::operator=(&(__return_storage_ptr__->value).data_,(ByteData *)(local_158 + 8));
      (__return_storage_ptr__->value).version_ = local_138;
    }
    local_158._0_8_ = &PTR__ConfidentialValue_007f6a50;
    if ((pointer)local_158._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._8_8_,local_158._24_8_ - local_158._8_8_);
    }
    if (asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)asset_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)asset_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vbf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vbf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)abf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)abf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    operator_delete(local_128,0x21);
    if (asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)asset_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)asset_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    operator_delete(local_f0,0x20);
    if (local_100 != (_func_int **)0x0) {
      operator_delete(local_100,(long)local_f8 - (long)local_100);
    }
    if (commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(commitment_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)commitment_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)commitment_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (rangeproof_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(rangeproof_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)rangeproof_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)rangeproof_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)nonce_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)nonce_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_158._0_8_ = "cfdcore_elements_transaction.cpp";
  local_158._8_4_ = 0xbe2;
  local_158._16_8_ = "CalculateUnblindIssueData";
  logger::log<int&>((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
                    "wally_asset_generator_from_bytes NG[{}].",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_158._0_8_ = local_158 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"asset generator error.","")
  ;
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_158);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindIssueData(
    const Privkey &blinding_key, const ByteData &rangeproof,
    const ConfidentialValue &value_commitment, const Script &extra,
    const ConfidentialAssetId &asset) {
  int ret;
  const std::vector<uint8_t> nonce_bytes = blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  std::vector<uint8_t> extra_bytes;
  if (!extra.IsEmpty()) {
    extra_bytes = extra.GetData().GetBytes();
  }

  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  memset(empty_factor.data(), 0, empty_factor.size());
  const std::vector<uint8_t> asset_bytes = asset.GetUnblindedData().GetBytes();
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), empty_factor.data(),
      empty_factor.size(), generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "asset generator error.");
  }

  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  ret = wally_asset_unblind_with_nonce(
      nonce_bytes.data(), nonce_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      generator.data(), generator.size(), asset_out.data(), asset_out.size(),
      abf_out.data(), abf_out.size(), vbf_out.data(), vbf_out.size(),
      &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind_with_nonce NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));
  return result;
}